

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::log_contexts(JUnitReporter *this,ostringstream *s)

{
  int iVar1;
  IContextScope **ppIVar2;
  char *pcVar3;
  int local_2c;
  int i;
  IContextScope **contexts;
  int num_contexts;
  ostringstream *s_local;
  JUnitReporter *this_local;
  
  iVar1 = IReporter::get_num_active_contexts();
  if (iVar1 != 0) {
    ppIVar2 = IReporter::get_active_contexts();
    std::operator<<((ostream *)s,"  logged: ");
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      pcVar3 = "          ";
      if (local_2c == 0) {
        pcVar3 = "";
      }
      std::operator<<((ostream *)s,pcVar3);
      (*ppIVar2[local_2c]->_vptr_IContextScope[2])(ppIVar2[local_2c],s);
      std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void log_contexts(std::ostringstream& s) {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << std::endl;
                }
            }
        }